

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O1

QString * __thiscall QProgressBar::text(QString *__return_storage_ptr__,QProgressBar *this)

{
  long lVar1;
  Data *pDVar2;
  uint uVar3;
  long in_FS_OFFSET;
  QLatin1String QVar4;
  QLatin1String QVar5;
  QLatin1String QVar6;
  QLocale locale;
  QArrayData *local_58 [3];
  QLocale local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if ((*(int *)(lVar1 + 600) != 0) || (*(int *)(lVar1 + 0x254) != 0)) {
    if ((*(int *)(lVar1 + 0x254) <= *(int *)(lVar1 + 0x25c)) &&
       (*(int *)(lVar1 + 0x254) != -0x80000000 || *(int *)(lVar1 + 0x25c) != -0x80000000)) {
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pDVar2 = *(Data **)(lVar1 + 0x278);
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = *(char16_t **)(lVar1 + 0x280);
      (__return_storage_ptr__->d).size = *(qsizetype *)(lVar1 + 0x288);
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_40 = (QLocale)&DAT_aaaaaaaaaaaaaaaa;
      QLocale::QLocale(&local_40,(QLocale *)(lVar1 + 0x210));
      uVar3 = QLocale::numberOptions();
      QLocale::setNumberOptions(&local_40,uVar3 | 1);
      QLocale::toString((longlong)local_58);
      QVar4.m_data = (char *)0x2;
      QVar4.m_size = (qsizetype)__return_storage_ptr__;
      QString::replace(QVar4,(QString *)"%m",(CaseSensitivity)local_58);
      if (local_58[0] != (QArrayData *)0x0) {
        LOCK();
        (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58[0],2,0x10);
        }
      }
      QLocale::toString((longlong)local_58);
      QVar5.m_data = (char *)0x2;
      QVar5.m_size = (qsizetype)__return_storage_ptr__;
      QString::replace(QVar5,(QString *)"%v",(CaseSensitivity)local_58);
      if (local_58[0] != (QArrayData *)0x0) {
        LOCK();
        (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58[0],2,0x10);
        }
      }
      QLocale::toString((longlong)local_58);
      QVar6.m_data = (char *)0x2;
      QVar6.m_size = (qsizetype)__return_storage_ptr__;
      QString::replace(QVar6,(QString *)0x702e8e,(CaseSensitivity)local_58);
      if (local_58[0] != (QArrayData *)0x0) {
        LOCK();
        (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58[0],2,0x10);
        }
      }
      QLocale::~QLocale(&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      goto LAB_0047210e;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
LAB_0047210e:
  __stack_chk_fail();
}

Assistant:

QString QProgressBar::text() const
{
    Q_D(const QProgressBar);
    if ((d->maximum == 0 && d->minimum == 0) || d->value < d->minimum
            || (d->value == INT_MIN && d->minimum == INT_MIN))
        return QString();

    qint64 totalSteps = qint64(d->maximum) - d->minimum;

    QString result = d->format;
    QLocale locale = d->locale; // Omit group separators for compatibility with previous versions that were non-localized.
    locale.setNumberOptions(locale.numberOptions() | QLocale::OmitGroupSeparator);
    result.replace("%m"_L1, locale.toString(totalSteps));
    result.replace("%v"_L1, locale.toString(d->value));

    // If max and min are equal and we get this far, it means that the
    // progress bar has one step and that we are on that step. Return
    // 100% here in order to avoid division by zero further down.
    if (totalSteps == 0) {
        result.replace("%p"_L1, locale.toString(100));
        return result;
    }

    const auto progress = static_cast<int>((qint64(d->value) - d->minimum) * 100.0 / totalSteps);
    result.replace("%p"_L1, locale.toString(progress));
    return result;
}